

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O3

void __thiscall
InstructionGenerator::genCreateInt(InstructionGenerator *this,string *identifier,uint val)

{
  pointer pcVar1;
  pointer puVar2;
  iterator iVar3;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint local_54;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  bool local_28;
  uint local_24;
  
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
  local_50._0_4_ = CHAR;
  iVar3._M_current = *(uint **)(this_00 + 8);
  puVar2 = *(pointer *)(this_00 + 0x10);
  local_54 = val;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar3,
               (Instruction *)local_50);
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
    iVar3._M_current = *(uint **)(this_00 + 8);
    puVar2 = *(pointer *)(this_00 + 0x10);
  }
  else {
    *iVar3._M_current = 1;
    iVar3._M_current = iVar3._M_current + 1;
    *(uint **)(this_00 + 8) = iVar3._M_current;
  }
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              (this_00,iVar3,&local_54);
  }
  else {
    *iVar3._M_current = val;
    *(uint **)(this_00 + 8) = iVar3._M_current + 1;
  }
  local_50._0_4_ = INT;
  pcVar1 = (identifier->_M_dataplus)._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + identifier->_M_string_length);
  local_28 = false;
  local_24 = 0;
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  return;
}

Assistant:

void InstructionGenerator::genCreateInt(const std::string &identifier, unsigned int val)
{
    bytecode->emplace_back(Instruction::CREATE_INT);
    bytecode->emplace_back(val);
    push(Variable(identifier, DataType::INT));
}